

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::ktxStreamTest_CanCreateKtx1FromCppStream_Test::
ktxStreamTest_CanCreateKtx1FromCppStream_Test(ktxStreamTest_CanCreateKtx1FromCppStream_Test *this)

{
  ktxStreamTest *in_RDI;
  
  ktxStreamTest::ktxStreamTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)&PTR__ktxStreamTest_CanCreateKtx1FromCppStream_Test_00191780;
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateKtx1FromCppStream)
{
    StreambufStream ktx1Stream{std::move(_ktx1Streambuf), std::ios::in};
    KtxTexture<ktxTexture1> texture1;

    KTX_error_code err = ktxTexture1_CreateFromStream(ktx1Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                                      texture1.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create KTX1 from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture1, nullptr) << "Newly-created KTX1 is null";
    EXPECT_TRUE(ktx1Stream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}